

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall t_rb_generator::generate_const(t_rb_generator *this,t_const *tconst)

{
  t_rb_ofstream *this_00;
  t_type *type;
  t_const_value *value;
  int iVar1;
  t_rb_ofstream *ptVar2;
  ostream *poVar3;
  string name;
  char *local_40 [4];
  
  type = tconst->type_;
  std::__cxx11::string::string((string *)local_40,(string *)&tconst->name_);
  value = tconst->value_;
  iVar1 = toupper((int)*local_40[0]);
  *local_40[0] = (char)iVar1;
  this_00 = &this->f_consts_;
  ptVar2 = t_rb_ofstream::indent(this_00);
  poVar3 = std::operator<<((ostream *)ptVar2,(string *)local_40);
  std::operator<<(poVar3," = ");
  render_const_value(this,this_00,type,value);
  poVar3 = std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_rb_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  name[0] = toupper(name[0]);

  f_consts_.indent() << name << " = ";
  render_const_value(f_consts_, type, value) << endl << endl;
}